

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O0

void __thiscall Calc::CalcParser::Evaluate(CalcParser *this,istream *stream)

{
  pointer *this_00;
  bool bVar1;
  runtime_error *this_01;
  undefined1 local_1e8 [8];
  Parse<SGParser::ParseStackGenericElement> parser;
  undefined1 local_b0 [8];
  DFATokenizer<SGParser::GenericToken> tokenizer;
  StdStreamAdapter input;
  istream *stream_local;
  CalcParser *this_local;
  
  this_00 = &tokenizer.ExpressionStack.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  StdStreamAdapter::StdStreamAdapter((StdStreamAdapter *)this_00,stream);
  SGParser::DFATokenizer<SGParser::GenericToken>::DFATokenizer
            ((DFATokenizer<SGParser::GenericToken> *)local_b0,&this->automata,(InputStream *)this_00
            );
  SGParser::Parse<SGParser::ParseStackGenericElement>::Parse
            ((Parse<SGParser::ParseStackGenericElement> *)local_1e8,(ParseTable *)0x0,0x800);
  bVar1 = SGParser::Parse<SGParser::ParseStackGenericElement>::Create
                    ((Parse<SGParser::ParseStackGenericElement> *)local_1e8,&this->table,
                     (TokenStream<SGParser::GenericToken> *)local_b0,0x800);
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"failed to create parser");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<float,_std::allocator<float>_>::clear(&this->numbers);
  SGParser::Parse<SGParser::ParseStackGenericElement>::DoParse
            ((Parse<SGParser::ParseStackGenericElement> *)local_1e8,
             &this->super_ParseHandler<SGParser::ParseStackGenericElement>);
  SGParser::Parse<SGParser::ParseStackGenericElement>::~Parse
            ((Parse<SGParser::ParseStackGenericElement> *)local_1e8);
  SGParser::DFATokenizer<SGParser::GenericToken>::~DFATokenizer
            ((DFATokenizer<SGParser::GenericToken> *)local_b0);
  StdStreamAdapter::~StdStreamAdapter
            ((StdStreamAdapter *)
             &tokenizer.ExpressionStack.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Evaluate(std::istream& stream) {
        StdStreamAdapter                input{stream};
        DFATokenizer<GenericToken>      tokenizer{&automata, &input};
        Parse<ParseStackGenericElement> parser;
        
        if (parser.Create(&table, &tokenizer) == false)
            throw std::runtime_error("failed to create parser");

        numbers.clear();

        parser.DoParse(*this);
    }